

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

int Aig_ManReduceLachesCount(Aig_Man_t *p)

{
  ulong *puVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  int iVar7;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                  ,0x15f,"int Aig_ManReduceLachesCount(Aig_Man_t *)");
  }
  for (iVar6 = 0; iVar6 < p->vObjs->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,iVar6);
    if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + 0x18) & 0x30) != 0)) {
      __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                    ,0x161,"int Aig_ManReduceLachesCount(Aig_Man_t *)");
    }
  }
  iVar7 = p->nObjs[3] - p->nRegs;
  iVar6 = 0;
  do {
    p_00 = p->vCos;
    iVar2 = p_00->nSize;
    if (iVar2 <= iVar7) {
      for (iVar7 = p->nObjs[3] - p->nRegs; iVar7 < iVar2; iVar7 = iVar7 + 1) {
        pvVar3 = Vec_PtrEntry(p_00,iVar7);
        puVar1 = (ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18);
        *puVar1 = *puVar1 & 0xffffffffffffffcf;
        p_00 = p->vCos;
        iVar2 = p_00->nSize;
      }
      return iVar6;
    }
    pvVar3 = Vec_PtrEntry(p_00,iVar7);
    uVar4 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
    uVar5 = *(ulong *)(uVar4 + 0x18);
    if ((*(ulong *)((long)pvVar3 + 8) & 1) == 0) {
      if ((uVar5 & 0x10) == 0) {
        uVar5 = uVar5 | 0x10;
        goto LAB_0052ef59;
      }
LAB_0052ef5f:
      iVar6 = iVar6 + 1;
    }
    else {
      if ((uVar5 & 0x20) != 0) goto LAB_0052ef5f;
      uVar5 = uVar5 | 0x20;
LAB_0052ef59:
      *(ulong *)(uVar4 + 0x18) = uVar5;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int Aig_ManReduceLachesCount( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin;
    int i, Counter = 0, Diffs = 0;
    assert( Aig_ManRegNum(p) > 0 );
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjFaninC0(pObj) )
        {
            if ( pFanin->fMarkB )
                Counter++;
            else
                pFanin->fMarkB = 1;
        }
        else
        {
            if ( pFanin->fMarkA )
                Counter++;
            else
                pFanin->fMarkA = 1;
        }
    }
    // count fanins that have both attributes
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
//    printf( "Diffs = %d.\n", Diffs );
    return Counter;
}